

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_manager.cpp
# Opt level: O2

void __thiscall
duckdb::MetadataManager::MetadataManager
          (MetadataManager *this,BlockManager *block_manager,BufferManager *buffer_manager)

{
  this->block_manager = block_manager;
  this->buffer_manager = buffer_manager;
  (this->blocks)._M_h._M_buckets = &(this->blocks)._M_h._M_single_bucket;
  (this->blocks)._M_h._M_bucket_count = 1;
  (this->blocks)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->blocks)._M_h._M_element_count = 0;
  (this->blocks)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->blocks)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->blocks)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->modified_blocks)._M_h._M_buckets = &(this->modified_blocks)._M_h._M_single_bucket;
  (this->modified_blocks)._M_h._M_bucket_count = 1;
  (this->modified_blocks)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->modified_blocks)._M_h._M_element_count = 0;
  (this->modified_blocks)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->modified_blocks)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->modified_blocks)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

MetadataManager::MetadataManager(BlockManager &block_manager, BufferManager &buffer_manager)
    : block_manager(block_manager), buffer_manager(buffer_manager) {
}